

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetBXSingleStray(ndicapi *pol,int portHandle,float *outCoord)

{
  uint uVar1;
  uint local_2c;
  int n;
  int i;
  float *outCoord_local;
  int portHandle_local;
  ndicapi *pol_local;
  
  uVar1 = (uint)pol->BxHandleCount;
  local_2c = 0;
  while (((int)local_2c < (int)uVar1 && (pol->BxHandles[(int)local_2c] != portHandle))) {
    local_2c = local_2c + 1;
  }
  if (local_2c != uVar1) {
    *(undefined8 *)outCoord = *(undefined8 *)pol->BxActiveSingleStrayMarkerPosition[(int)local_2c];
    outCoord[2] = pol->BxActiveSingleStrayMarkerPosition[(int)local_2c][2];
  }
  pol_local._4_4_ = (uint)(local_2c == uVar1);
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiGetBXSingleStray(ndicapi* pol, int portHandle, float outCoord[3])
{
  int i, n;

  n = pol->BxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->BxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return NDI_DISABLED;
  }

  memcpy(outCoord, pol->BxActiveSingleStrayMarkerPosition[i], sizeof(float) * 3);
  return NDI_OKAY;
}